

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  int num_rects;
  uint uVar1;
  CustomRect *pCVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ImVector<stbrp_rect> pack_rects;
  stbrp_rect *psStack_30;
  
  psStack_30 = (stbrp_rect *)0x0;
  num_rects = (atlas->CustomRects).Size;
  if (0 < num_rects) {
    iVar5 = 8;
    if (7 < num_rects) {
      iVar5 = num_rects;
    }
    if (0 < iVar5) {
      psStack_30 = (stbrp_rect *)ImGui::MemAlloc((long)iVar5 << 4);
    }
  }
  memset(psStack_30,0,(long)num_rects << 4);
  lVar3 = (long)(atlas->CustomRects).Size;
  if (0 < lVar3) {
    pCVar2 = (atlas->CustomRects).Data;
    lVar4 = 0;
    do {
      *(undefined4 *)((long)&psStack_30->w + lVar4) = *(undefined4 *)(&pCVar2->Width + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (lVar3 * 0x10 != lVar4);
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,psStack_30,num_rects);
  if (0 < (long)num_rects) {
    lVar3 = 0;
    do {
      if (*(int *)((long)&psStack_30->was_packed + lVar3) != 0) {
        uVar1 = *(uint *)((long)&psStack_30->x + lVar3);
        *(uint *)(&((atlas->CustomRects).Data)->X + lVar3) = uVar1;
        iVar5 = (uint)*(ushort *)((long)&psStack_30->h + lVar3) + (uVar1 >> 0x10);
        if (iVar5 < atlas->TexHeight) {
          iVar5 = atlas->TexHeight;
        }
        atlas->TexHeight = iVar5;
      }
      lVar3 = lVar3 + 0x10;
    } while ((long)num_rects * 0x10 != lVar3);
  }
  if (psStack_30 != (stbrp_rect *)0x0) {
    ImGui::MemFree(psStack_30);
  }
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;

    ImVector<ImFontAtlas::CustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}